

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

bool __thiscall mkvmuxer::VideoTrack::Write(VideoTrack *this,IMkvWriter *writer)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint64_t uVar4;
  int extraout_var;
  int extraout_var_00;
  IMkvWriter *in_RSI;
  IMkvWriter *in_RDI;
  int64_t stop_position;
  int64_t payload_position;
  uint64_t size;
  uint64 in_stack_ffffffffffffffa8;
  _func_int **value;
  IMkvWriter *in_stack_ffffffffffffffb0;
  IMkvWriter *writer_00;
  IMkvWriter *in_stack_ffffffffffffffb8;
  Colour *this_00;
  VideoTrack *in_stack_ffffffffffffffc0;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  bVar1 = Track::Write((Track *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),in_RDI
                      );
  if (bVar1) {
    uVar4 = VideoPayloadSize(in_stack_ffffffffffffffc0);
    bVar1 = WriteEbmlMasterElement
                      (in_stack_ffffffffffffffb8,(uint64)in_stack_ffffffffffffffb0,
                       in_stack_ffffffffffffffa8);
    if (bVar1) {
      iVar2 = (*in_RSI->_vptr_IMkvWriter[1])();
      if (extraout_var < 0) {
        bVar1 = false;
      }
      else {
        if (in_RDI[0x12]._vptr_IMkvWriter == (_func_int **)0x0) {
          this_00 = (Colour *)in_RDI[0x1b]._vptr_IMkvWriter;
        }
        else {
          this_00 = (Colour *)in_RDI[0x12]._vptr_IMkvWriter;
        }
        bVar1 = WriteEbmlElement(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,0x17ad74);
        if (bVar1) {
          if (in_RDI[0x11]._vptr_IMkvWriter == (_func_int **)0x0) {
            value = in_RDI[0x18]._vptr_IMkvWriter;
          }
          else {
            value = in_RDI[0x11]._vptr_IMkvWriter;
          }
          writer_00 = in_RSI;
          bVar1 = WriteEbmlElement(in_RSI,(uint64)value,0x17add0);
          if (bVar1) {
            if ((in_RDI[0x10]._vptr_IMkvWriter == (_func_int **)0x0) ||
               (bVar1 = WriteEbmlElement(writer_00,(uint64)value,0x17ae08), bVar1)) {
              if ((in_RDI[0xf]._vptr_IMkvWriter == (_func_int **)0x0) ||
                 (bVar1 = WriteEbmlElement(writer_00,(uint64)value,0x17ae3c), bVar1)) {
                if ((in_RDI[0x13]._vptr_IMkvWriter == (_func_int **)0x0) ||
                   (bVar1 = WriteEbmlElement(writer_00,(uint64)value,0x17ae76), bVar1)) {
                  if ((in_RDI[0x14]._vptr_IMkvWriter == (_func_int **)0x0) ||
                     (bVar1 = WriteEbmlElement(writer_00,(uint64)value,0x17aeb0), bVar1)) {
                    if ((in_RDI[0x15]._vptr_IMkvWriter == (_func_int **)0x0) ||
                       (bVar1 = WriteEbmlElement(writer_00,(uint64)value,0x17aeea), bVar1)) {
                      if ((in_RDI[0x16]._vptr_IMkvWriter == (_func_int **)0x0) ||
                         (bVar1 = WriteEbmlElement(writer_00,(uint64)value,0x17af24), bVar1)) {
                        if ((in_RDI[0x19]._vptr_IMkvWriter == (_func_int **)0x0) ||
                           (bVar1 = WriteEbmlElement(writer_00,(uint64)value,0x17af5e), bVar1)) {
                          if ((in_RDI[0x1a]._vptr_IMkvWriter == (_func_int **)0x0) ||
                             (bVar1 = WriteEbmlElement(writer_00,(uint64)value,0x17af98), bVar1)) {
                            if ((in_RDI[0x1c]._vptr_IMkvWriter == (_func_int **)0x0) ||
                               (bVar1 = WriteEbmlElement((IMkvWriter *)this_00,(uint64)writer_00,
                                                         (char *)value), bVar1)) {
                              if (((double)in_RDI[0x17]._vptr_IMkvWriter <= 0.0) ||
                                 (bVar1 = WriteEbmlElement((IMkvWriter *)this_00,(uint64)writer_00,
                                                           (float)((ulong)value >> 0x20)), bVar1)) {
                                if ((in_RDI[0x1d]._vptr_IMkvWriter == (_func_int **)0x0) ||
                                   (bVar1 = Colour::Write(this_00,writer_00), bVar1)) {
                                  if ((in_RDI[0x1e]._vptr_IMkvWriter == (_func_int **)0x0) ||
                                     (bVar1 = Projection::Write((Projection *)this_00,writer_00),
                                     bVar1)) {
                                    iVar3 = (*in_RSI->_vptr_IMkvWriter[1])();
                                    if ((extraout_var_00 < 0) ||
                                       (CONCAT44(extraout_var_00,iVar3) -
                                        CONCAT44(extraout_var,iVar2) != uVar4)) {
                                      bVar1 = false;
                                    }
                                    else {
                                      bVar1 = true;
                                    }
                                  }
                                  else {
                                    bVar1 = false;
                                  }
                                }
                                else {
                                  bVar1 = false;
                                }
                              }
                              else {
                                bVar1 = false;
                              }
                            }
                            else {
                              bVar1 = false;
                            }
                          }
                          else {
                            bVar1 = false;
                          }
                        }
                        else {
                          bVar1 = false;
                        }
                      }
                      else {
                        bVar1 = false;
                      }
                    }
                    else {
                      bVar1 = false;
                    }
                  }
                  else {
                    bVar1 = false;
                  }
                }
                else {
                  bVar1 = false;
                }
              }
              else {
                bVar1 = false;
              }
            }
            else {
              bVar1 = false;
            }
          }
          else {
            bVar1 = false;
          }
        }
        else {
          bVar1 = false;
        }
      }
    }
    else {
      bVar1 = false;
    }
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool VideoTrack::Write(IMkvWriter* writer) const {
  if (!Track::Write(writer))
    return false;

  const uint64_t size = VideoPayloadSize();

  if (!WriteEbmlMasterElement(writer, libwebm::kMkvVideo, size))
    return false;

  const int64_t payload_position = writer->Position();
  if (payload_position < 0)
    return false;

  if (!WriteEbmlElement(
          writer, libwebm::kMkvPixelWidth,
          static_cast<uint64>((pixel_width_ > 0) ? pixel_width_ : width_)))
    return false;
  if (!WriteEbmlElement(
          writer, libwebm::kMkvPixelHeight,
          static_cast<uint64>((pixel_height_ > 0) ? pixel_height_ : height_)))
    return false;
  if (display_width_ > 0) {
    if (!WriteEbmlElement(writer, libwebm::kMkvDisplayWidth,
                          static_cast<uint64>(display_width_)))
      return false;
  }
  if (display_height_ > 0) {
    if (!WriteEbmlElement(writer, libwebm::kMkvDisplayHeight,
                          static_cast<uint64>(display_height_)))
      return false;
  }
  if (crop_left_ > 0) {
    if (!WriteEbmlElement(writer, libwebm::kMkvPixelCropLeft,
                          static_cast<uint64>(crop_left_)))
      return false;
  }
  if (crop_right_ > 0) {
    if (!WriteEbmlElement(writer, libwebm::kMkvPixelCropRight,
                          static_cast<uint64>(crop_right_)))
      return false;
  }
  if (crop_top_ > 0) {
    if (!WriteEbmlElement(writer, libwebm::kMkvPixelCropTop,
                          static_cast<uint64>(crop_top_)))
      return false;
  }
  if (crop_bottom_ > 0) {
    if (!WriteEbmlElement(writer, libwebm::kMkvPixelCropBottom,
                          static_cast<uint64>(crop_bottom_)))
      return false;
  }
  if (stereo_mode_ > kMono) {
    if (!WriteEbmlElement(writer, libwebm::kMkvStereoMode,
                          static_cast<uint64>(stereo_mode_)))
      return false;
  }
  if (alpha_mode_ > kNoAlpha) {
    if (!WriteEbmlElement(writer, libwebm::kMkvAlphaMode,
                          static_cast<uint64>(alpha_mode_)))
      return false;
  }
  if (colour_space_) {
    if (!WriteEbmlElement(writer, libwebm::kMkvColourSpace, colour_space_))
      return false;
  }
  if (frame_rate_ > 0.0) {
    if (!WriteEbmlElement(writer, libwebm::kMkvFrameRate,
                          static_cast<float>(frame_rate_))) {
      return false;
    }
  }
  if (colour_) {
    if (!colour_->Write(writer))
      return false;
  }
  if (projection_) {
    if (!projection_->Write(writer))
      return false;
  }

  const int64_t stop_position = writer->Position();
  if (stop_position < 0 ||
      stop_position - payload_position != static_cast<int64_t>(size)) {
    return false;
  }

  return true;
}